

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O1

void menu_refresh(menu *menu,_Bool reset_screen)

{
  int iVar1;
  undefined7 in_register_00000031;
  
  iVar1 = menu->cursor;
  if ((int)CONCAT71(in_register_00000031,reset_screen) != 0) {
    screen_load();
    screen_save();
  }
  if ((menu->filter_list != (int *)0x0) && (-1 < menu->cursor)) {
    iVar1 = menu->filter_list[iVar1];
  }
  if (menu->title != (char *)0x0) {
    Term_putstr((menu->boundary).col,(menu->boundary).row,(menu->active).width,L'\x01',menu->title);
  }
  if (menu->header != (char *)0x0) {
    Term_putstr((menu->active).col,(menu->active).row + L'\xffffffff',(menu->active).width,L'\x01',
                menu->header);
  }
  if (menu->prompt != (char *)0x0) {
    Term_putstr((menu->boundary).col,(menu->active).page_rows + (menu->active).row,
                (menu->active).width,L'\x01',menu->prompt);
  }
  if ((menu->browse_hook != (_func_void_int_void_ptr_region_ptr *)0x0) && (-1 < iVar1)) {
    (*menu->browse_hook)(iVar1,menu->menu_data,&menu->active);
  }
  (*menu->skin->display_list)(menu,menu->cursor,&menu->top,&menu->active);
  return;
}

Assistant:

void menu_refresh(struct menu *menu, bool reset_screen)
{
	int oid = menu->cursor;
	region *loc = &menu->active;

	if (reset_screen) {
		screen_load();
		screen_save();
	}

	if (menu->filter_list && menu->cursor >= 0)
		oid = menu->filter_list[oid];

	if (menu->title)
		Term_putstr(menu->boundary.col, menu->boundary.row,
				loc->width, COLOUR_WHITE, menu->title);

	if (menu->header)
		Term_putstr(loc->col, loc->row - 1, loc->width,
				COLOUR_WHITE, menu->header);

	if (menu->prompt)
		Term_putstr(menu->boundary.col, loc->row + loc->page_rows,
				loc->width, COLOUR_WHITE, menu->prompt);

	if (menu->browse_hook && oid >= 0)
		menu->browse_hook(oid, menu->menu_data, loc);

	menu->skin->display_list(menu, menu->cursor, &menu->top, loc);
}